

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

JavascriptWeakSet * __thiscall Js::JavascriptLibrary::CreateWeakSet(JavascriptLibrary *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Recycler *alloc;
  JavascriptWeakSet *this_00;
  undefined1 local_40 [8];
  TrackAllocData data;
  
  if ((this->weakSetType).ptr == (DynamicType *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x181f,"(weakSetType)","Where\'s weakSetType?");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  local_40 = (undefined1  [8])&JavascriptWeakSet::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_74a5554;
  data.filename._0_4_ = 0x1820;
  alloc = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_40);
  this_00 = (JavascriptWeakSet *)new<Memory::Recycler>(0x60,alloc,0x391482);
  JavascriptWeakSet::JavascriptWeakSet(this_00,(this->weakSetType).ptr);
  return this_00;
}

Assistant:

JavascriptWeakSet* JavascriptLibrary::CreateWeakSet()
    {
        AssertMsg(weakSetType, "Where's weakSetType?");
        return RecyclerNewFinalized(this->GetRecycler(), JavascriptWeakSet, weakSetType);
    }